

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tshort
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,double actual_bzero,int *intlength,
              int *status)

{
  short sVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  short *in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  int *in_XMM2_Qa;
  long ii;
  int *idata;
  int *in_stack_00000018;
  int flagval;
  short *sbuff;
  long local_70;
  int shift;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  if (((((int)ii != 0x10) || (in_XMM0_Qa != 1.0)) || (NAN(in_XMM0_Qa))) ||
     ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))) {
    ffpmsg((char *)0x1e3fb9);
    *in_stack_00000018 = 0x19d;
    local_4 = 0x19d;
  }
  else {
    if (((*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0xb) ||
        (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x15)) ||
       ((*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16 ||
        (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x33)))) {
      *idata = 2;
      if ((in_ECX == 1) && (sVar1 = *in_R8, sVar1 != in_R9D)) {
        for (local_70 = in_RDX + -1; -1 < local_70; local_70 = local_70 + -1) {
          if (*(short *)(in_RSI + local_70 * 2) == sVar1) {
            *(short *)(in_RSI + local_70 * 2) = (short)in_R9D;
          }
        }
      }
    }
    else {
      shift = (int)((ulong)in_XMM1_Qa >> 0x20);
      if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x29) {
        *idata = 4;
        if (in_ECX == 1) {
          sVar1 = *in_R8;
          for (local_70 = in_RDX + -1; -1 < local_70; local_70 = local_70 + -1) {
            if (*(short *)(in_RSI + local_70 * 2) == sVar1) {
              *(int *)(in_RSI + local_70 * 4) = in_R9D;
            }
            else {
              *(int *)(in_RSI + local_70 * 4) = (int)*(short *)(in_RSI + local_70 * 2);
            }
          }
        }
        else {
          fits_short_to_int_inplace
                    ((short *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),(long)in_XMM0_Qa,shift,
                     in_XMM2_Qa);
        }
      }
      else {
        *idata = 4;
        if ((((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) || ((double)in_XMM2_Qa != 32768.0)) ||
           (NAN((double)in_XMM2_Qa))) {
          if (in_ECX == 1) {
            sVar1 = *in_R8;
            for (local_70 = in_RDX + -1; -1 < local_70; local_70 = local_70 + -1) {
              if (*(short *)(in_RSI + local_70 * 2) == sVar1) {
                *(int *)(in_RSI + local_70 * 4) = in_R9D;
              }
              else {
                *(int *)(in_RSI + local_70 * 4) = (int)*(short *)(in_RSI + local_70 * 2);
              }
            }
          }
          else {
            fits_short_to_int_inplace
                      ((short *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),(long)in_XMM0_Qa,shift,
                       in_XMM2_Qa);
          }
        }
        else if (in_ECX == 1) {
          sVar1 = *in_R8;
          for (local_70 = in_RDX + -1; -1 < local_70; local_70 = local_70 + -1) {
            if (*(short *)(in_RSI + local_70 * 2) == sVar1) {
              *(int *)(in_RSI + local_70 * 4) = in_R9D;
            }
            else {
              *(int *)(in_RSI + local_70 * 4) = *(short *)(in_RSI + local_70 * 2) + 0x8000;
            }
          }
        }
        else {
          fits_short_to_int_inplace
                    ((short *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),(long)in_XMM0_Qa,shift,
                     in_XMM2_Qa);
        }
      }
    }
    local_4 = *in_stack_00000018;
  }
  return local_4;
}

Assistant:

int imcomp_convert_tile_tshort(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    double actual_bzero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input integer*2 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    short *sbuff;
    int flagval, *idata;
    long ii;
    
       /* We only support writing this integer*2 tile data to a FITS image with 
          BITPIX = 16 and with BZERO = 0 and BSCALE = 1.  */
	  
       if (zbitpix != SHORT_IMG || scale != 1.0 || zero != 0.0) {
           ffpmsg("Datatype conversion/scaling is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       sbuff = (short *) tiledata;
       idata = (int *) tiledata;
       
       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2 or Rice compression */
           *intlength = 2;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(short *) (nullflagval);
               if (flagval != nullval) {
                  for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbuff[ii] == (short) flagval)
		       sbuff[ii] = (short) nullval;
                  }
               }
           }
       } else if ((outfptr->Fptr)->compress_type == HCOMPRESS_1) {
           /* have to convert to int if using HCOMPRESS */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbuff[ii] == (short) flagval)
		       idata[ii] = nullval;
                    else 
                       idata[ii] = (int) sbuff[ii];
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert sbuff to an I*4 array, in place */
                 /* sbuff must have been allocated large enough to do this */
                 fits_short_to_int_inplace(sbuff, tilelen, 0, status);
           }
       } else {
           /* have to convert to int if using PLIO */
           *intlength = 4;
           if (zero == 0. && actual_bzero == 32768.) {
             /* Here we are compressing unsigned 16-bit integers that have */
	     /* been offset by -32768 using the standard FITS convention. */
	     /* Since PLIO cannot deal with negative values, we must apply */
	     /* the shift of 32786 to the values to make them all positive. */
	     /* The inverse negative shift will be applied in */
	     /* imcomp_decompress_tile when reading the compressed tile. */
             if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbuff[ii] == (short) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = (int) sbuff[ii] + 32768;
               }
             } else {  
                 /* have to convert sbuff to an I*4 array, in place */
                 /* sbuff must have been allocated large enough to do this */
                 fits_short_to_int_inplace(sbuff, tilelen, 32768, status);
             }
           } else {
	     /* This is not an unsigned 16-bit integer array, so process normally */
             if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbuff[ii] == (short) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = (int) sbuff[ii];
               }
             } else {  /* just do the data type conversion to int */
                 /* have to convert sbuff to an I*4 array, in place */
                 /* sbuff must have been allocated large enough to do this */
                 fits_short_to_int_inplace(sbuff, tilelen, 0, status);
             }
           }
        }
        return(*status);
}